

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall cfd::js::api::json::TxOutRequest::TxOutRequest(TxOutRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::TxOutRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__TxOutRequest_00a78e40;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->address_)._M_dataplus._M_p = (pointer)&(this->address_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  this->amount_ = 0;
  (this->direct_locking_script_)._M_dataplus._M_p = (pointer)&(this->direct_locking_script_).field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->direct_locking_script_,"");
  CollectFieldName();
  return;
}

Assistant:

TxOutRequest() {
    CollectFieldName();
  }